

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex2-server.c
# Opt level: O3

void ssh2kex_coroutine(ssh2_transport_state *s,_Bool *aborted)

{
  BinarySink *pBVar1;
  int iVar2;
  PacketLogSettings *pPVar3;
  ssh_hash *psVar4;
  size_t sVar5;
  ssh_kex *kex;
  uint *puVar6;
  LogContext *pLVar7;
  _Bool _Var8;
  uint uVar9;
  ProgressReceiverVtable *in_RAX;
  PktIn *pPVar10;
  mp_int *pmVar11;
  PktOut *pPVar12;
  strbuf *psVar13;
  unsigned_long uVar14;
  ecdh_key *peVar15;
  PrimeGenerationContext *pPVar16;
  PrimeCandidateSource *pPVar17;
  dh_ctx *pdVar18;
  RSAKey *pRVar19;
  Ssh *pSVar20;
  char *pcVar21;
  char *pcVar22;
  long lVar23;
  ptrlen pVar24;
  ProgressReceiver null_progress;
  ProgressReceiver local_38;
  
  iVar2 = s->crStateKex;
  local_38.vt = in_RAX;
  if (iVar2 < 0x88) {
    if (iVar2 == 0) {
      if (0 < (long)s->nhostkeys) {
        lVar23 = 0;
        do {
          if (s->hostkeys[lVar23]->vt == s->hostkey_alg) {
            s->hkey = s->hostkeys[lVar23];
            break;
          }
          lVar23 = lVar23 + 1;
        } while (s->nhostkeys != lVar23);
      }
      if (s->hkey == (ssh_key *)0x0) {
        __assert_fail("s->hkey",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/kex2-server.c"
                      ,0x36,"void ssh2kex_coroutine(struct ssh2_transport_state *, _Bool *)");
      }
      strbuf_shrink_to(s->hostkeyblob,0);
      (*s->hkey->vt->public_blob)(s->hkey,s->hostkeyblob->binarysink_);
      psVar4 = s->exhash;
      psVar13 = s->hostkeyblob;
      sVar5 = psVar13->len;
      pVar24.ptr = psVar13->u;
      pVar24.len = psVar13->len;
      (s->hostkeydata).ptr = psVar13->u;
      (s->hostkeydata).len = sVar5;
      BinarySink_put_stringpl(psVar4->binarysink_,pVar24);
      kex = s->kex_alg;
      switch(kex->main_type) {
      case KEXTYPE_DH:
        _Var8 = dh_is_gex(kex);
        if (_Var8) {
          pLVar7 = (s->ppl).logctx;
          pcVar22 = dupprintf("Doing Diffie-Hellman group exchange");
          logevent_and_free(pLVar7,pcVar22);
          ((s->ppl).bpp)->pls->kctx = SSH2_PKTCTX_DHGEX;
          s->crStateKex = 0x48;
          goto LAB_0012ddf5;
        }
        ((s->ppl).bpp)->pls->kctx = SSH2_PKTCTX_DHGROUP;
        pdVar18 = dh_setup_group(s->kex_alg);
        s->dh_ctx = pdVar18;
        s->kex_init_value = 0x1e;
        s->kex_reply_value = 0x1f;
        pLVar7 = (s->ppl).logctx;
        pcVar22 = dupprintf("Using Diffie-Hellman with standard group \"%s\"",s->kex_alg->groupname)
        ;
        logevent_and_free(pLVar7,pcVar22);
        goto LAB_0012e3a6;
      case KEXTYPE_RSA:
        pLVar7 = (s->ppl).logctx;
        pcVar22 = dupprintf("Doing RSA key exchange with hash %s",s->exhash->vt->text_name);
        logevent_and_free(pLVar7,pcVar22);
        ((s->ppl).bpp)->pls->kctx = SSH2_PKTCTX_RSAKEX;
        puVar6 = (uint *)s->kex_alg->extra;
        if ((s->ssc != (SshServerConfig *)0x0) &&
           (pRVar19 = s->ssc->rsa_kex_key, pRVar19 != (RSAKey *)0x0)) {
          uVar9 = ssh_rsakex_klen(pRVar19);
          pLVar7 = (s->ppl).logctx;
          if ((int)uVar9 < (int)*puVar6) {
            pcVar22 = dupprintf("Configured %d-bit RSA key is too short (min %d)",(ulong)uVar9);
            logevent_and_free(pLVar7,pcVar22);
          }
          else {
            pcVar22 = dupprintf("Using configured %d-bit RSA key",(ulong)uVar9);
            logevent_and_free(pLVar7,pcVar22);
            s->rsa_kex_key = s->ssc->rsa_kex_key;
          }
        }
        if (s->rsa_kex_key == (RSAKey *)0x0) {
          pLVar7 = (s->ppl).logctx;
          pcVar22 = dupprintf("Generating a %d-bit RSA key",(ulong)*puVar6);
          logevent_and_free(pLVar7,pcVar22);
          pRVar19 = (RSAKey *)safemalloc(1,0x48,0);
          s->rsa_kex_key = pRVar19;
          pPVar16 = probprime_new_context(&primegen_probabilistic);
          local_38.vt = &null_progress_vt;
          rsa_generate(s->rsa_kex_key,*puVar6,false,pPVar16,&local_38);
          (*pPVar16->vt->free_context)(pPVar16);
          s->rsa_kex_key->comment = (char *)0x0;
          s->rsa_kex_key_needs_freeing = true;
        }
        pPVar12 = (*((s->ppl).bpp)->vt->new_pktout)(0x1e);
        BinarySink_put_stringpl(pPVar12->binarysink_,s->hostkeydata);
        psVar13 = strbuf_new();
        (*((s->rsa_kex_key->sshk).vt)->public_blob)(&s->rsa_kex_key->sshk,psVar13->binarysink_);
        BinarySink_put_string(s->exhash->binarysink_,psVar13->u,psVar13->len);
        BinarySink_put_stringsb(pPVar12->binarysink_,psVar13);
        pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar12->qnode);
        s->crStateKex = 0x127;
LAB_0012dcec:
        pPVar10 = ssh2_transport_pop(s);
        if (pPVar10 == (PktIn *)0x0) {
          return;
        }
        uVar9 = pPVar10->type;
        if (uVar9 == 0x1f) {
          pVar24 = BinarySource_get_string(pPVar10->binarysource_);
          BinarySink_put_stringpl(s->exhash->binarysink_,pVar24);
          pmVar11 = ssh_rsakex_decrypt(s->rsa_kex_key,s->kex_alg->hash,pVar24);
          if (pmVar11 != (mp_int *)0x0) {
            BinarySink_put_mp_ssh2(s->kex_shared_secret->binarysink_,pmVar11);
            mp_free(pmVar11);
            if (s->rsa_kex_key_needs_freeing == true) {
              ssh_rsakex_freekey(s->rsa_kex_key);
              safefree(s->rsa_kex_key);
            }
            s->rsa_kex_key = (RSAKey *)0x0;
            s->rsa_kex_key_needs_freeing = false;
            pPVar12 = (*((s->ppl).bpp)->vt->new_pktout)(0x20);
            psVar13 = finalise_and_sign_exhash(s);
            BinarySink_put_stringsb(pPVar12->binarysink_,psVar13);
            pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar12->qnode);
            break;
          }
          pSVar20 = (s->ppl).ssh;
          pcVar22 = "Unable to decrypt RSA kex secret";
          goto LAB_0012e430;
        }
        pSVar20 = (s->ppl).ssh;
        pPVar3 = ((s->ppl).bpp)->pls;
        pcVar22 = ssh2_pkt_type(pPVar3->kctx,pPVar3->actx,uVar9);
        pcVar21 = "Received unexpected packet when expecting RSA kex secret, type %d (%s)";
        goto LAB_0012e462;
      case KEXTYPE_ECDH:
        pcVar22 = (*((kex->field_4).ecdh_vt)->description)(kex);
        pLVar7 = (s->ppl).logctx;
        pcVar21 = dupprintf("Doing %s, using hash %s",pcVar22,s->exhash->vt->text_name);
        logevent_and_free(pLVar7,pcVar21);
        safefree(pcVar22);
        peVar15 = (*((s->kex_alg->field_4).ecdh_vt)->new)(s->kex_alg,true);
        s->ecdh_key = peVar15;
        if (peVar15 != (ecdh_key *)0x0) {
          s->crStateKex = 0xce;
          goto LAB_0012dff2;
        }
        ssh_sw_abort((s->ppl).ssh,"Unable to generate key for ECDH");
        goto LAB_0012e471;
      case KEXTYPE_GSS:
        ssh_sw_abort((s->ppl).ssh,"GSS key exchange not supported in server");
        break;
      default:
        __assert_fail("s->kex_alg->main_type == KEXTYPE_RSA",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/kex2-server.c"
                      ,0xf8,"void ssh2kex_coroutine(struct ssh2_transport_state *, _Bool *)");
      }
    }
    else if (iVar2 == 0x48) {
LAB_0012ddf5:
      pPVar10 = ssh2_transport_pop(s);
      if (pPVar10 == (PktIn *)0x0) {
        return;
      }
      uVar9 = pPVar10->type;
      if (uVar9 == 0x1e) {
        s->dh_got_size_bounds = false;
        lVar23 = 0x1fc;
      }
      else {
        if (uVar9 != 0x22) {
          pSVar20 = (s->ppl).ssh;
          pPVar3 = ((s->ppl).bpp)->pls;
          pcVar22 = ssh2_pkt_type(pPVar3->kctx,pPVar3->actx,uVar9);
          pcVar21 = 
          "Received unexpected packet when expecting Diffie-Hellman group exchange request, type %d (%s)"
          ;
          goto LAB_0012e462;
        }
        s->dh_got_size_bounds = true;
        uVar14 = BinarySource_get_uint32(pPVar10->binarysource_);
        s->dh_min_size = (int)uVar14;
        uVar14 = BinarySource_get_uint32(pPVar10->binarysource_);
        s->pbits = (int)uVar14;
        lVar23 = 0x154;
      }
      uVar14 = BinarySource_get_uint32(pPVar10->binarysource_);
      *(int *)((long)&s->crState + lVar23) = (int)uVar14;
      pPVar16 = probprime_new_context(&primegen_probabilistic);
      local_38.vt = &null_progress_vt;
      pPVar17 = pcs_new(s->pbits);
      pmVar11 = (*pPVar16->vt->generate)(pPVar16,pPVar17,&local_38);
      s->p = pmVar11;
      (*pPVar16->vt->free_context)(pPVar16);
      pmVar11 = mp_from_integer(2);
      s->g = pmVar11;
      pdVar18 = dh_setup_gex(s->p,pmVar11);
      s->dh_ctx = pdVar18;
      s->kex_init_value = 0x20;
      s->kex_reply_value = 0x21;
      pPVar12 = (*((s->ppl).bpp)->vt->new_pktout)(0x1f);
      BinarySink_put_mp_ssh2(pPVar12->binarysink_,s->p);
      BinarySink_put_mp_ssh2(pPVar12->binarysink_,s->g);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar12->qnode);
LAB_0012e3a6:
      pLVar7 = (s->ppl).logctx;
      pcVar22 = dupprintf("Doing Diffie-Hellman key exchange with hash %s",s->exhash->vt->text_name)
      ;
      logevent_and_free(pLVar7,pcVar22);
      pmVar11 = dh_create_e(s->dh_ctx);
      s->e = pmVar11;
      s->crStateKex = 0x88;
      goto LAB_0012e3ee;
    }
LAB_0012e323:
    s->crStateKex = 0;
  }
  else {
    if (iVar2 != 0x88) {
      if (iVar2 == 0xce) {
LAB_0012dff2:
        pPVar10 = ssh2_transport_pop(s);
        if (pPVar10 == (PktIn *)0x0) {
          return;
        }
        uVar9 = pPVar10->type;
        if (uVar9 != 0x1e) {
          pSVar20 = (s->ppl).ssh;
          pPVar3 = ((s->ppl).bpp)->pls;
          pcVar22 = ssh2_pkt_type(pPVar3->kctx,pPVar3->actx,uVar9);
          pcVar21 = "Received unexpected packet when expecting ECDH initial packet, type %d (%s)";
          goto LAB_0012e462;
        }
        pVar24 = BinarySource_get_string(pPVar10->binarysource_);
        BinarySink_put_stringpl(s->exhash->binarysink_,pVar24);
        _Var8 = (*s->ecdh_key->vt->getkey)(s->ecdh_key,pVar24,s->kex_shared_secret->binarysink_);
        if ((pPVar10->binarysource_[0].err == BSE_NO_ERROR) && (!_Var8)) {
          pSVar20 = (s->ppl).ssh;
          pcVar22 = "Received invalid elliptic curve point in ECDH initial packet";
          goto LAB_0012e430;
        }
        pPVar12 = (*((s->ppl).bpp)->vt->new_pktout)(0x1f);
        pBVar1 = pPVar12->binarysink_;
        BinarySink_put_stringpl(pBVar1,s->hostkeydata);
        psVar13 = strbuf_new();
        (*s->ecdh_key->vt->getpublic)(s->ecdh_key,psVar13->binarysink_);
        BinarySink_put_string(s->exhash->binarysink_,psVar13->u,psVar13->len);
        BinarySink_put_stringsb(pBVar1,psVar13);
        psVar13 = finalise_and_sign_exhash(s);
        BinarySink_put_stringsb(pBVar1,psVar13);
        pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar12->qnode);
        (*s->ecdh_key->vt->free)(s->ecdh_key);
        s->ecdh_key = (ecdh_key *)0x0;
      }
      else if (iVar2 == 0x127) goto LAB_0012dcec;
      goto LAB_0012e323;
    }
LAB_0012e3ee:
    pPVar10 = ssh2_transport_pop(s);
    if (pPVar10 == (PktIn *)0x0) {
      return;
    }
    uVar9 = pPVar10->type;
    if (uVar9 == s->kex_init_value) {
      pmVar11 = BinarySource_get_mp_ssh2(pPVar10->binarysource_);
      s->f = pmVar11;
      if (pPVar10->binarysource_[0].err == BSE_NO_ERROR) {
        pcVar22 = dh_validate_f(s->dh_ctx,pmVar11);
        if (pcVar22 == (char *)0x0) {
          pmVar11 = dh_find_K(s->dh_ctx,s->f);
          BinarySink_put_mp_ssh2(s->kex_shared_secret->binarysink_,pmVar11);
          mp_free(pmVar11);
          _Var8 = dh_is_gex(s->kex_alg);
          if (_Var8) {
            if (s->dh_got_size_bounds == true) {
              BinarySink_put_uint32(s->exhash->binarysink_,(long)s->dh_min_size);
            }
            BinarySink_put_uint32(s->exhash->binarysink_,(long)s->pbits);
            if (s->dh_got_size_bounds == true) {
              BinarySink_put_uint32(s->exhash->binarysink_,(long)s->dh_max_size);
            }
            BinarySink_put_mp_ssh2(s->exhash->binarysink_,s->p);
            BinarySink_put_mp_ssh2(s->exhash->binarysink_,s->g);
          }
          BinarySink_put_mp_ssh2(s->exhash->binarysink_,s->f);
          BinarySink_put_mp_ssh2(s->exhash->binarysink_,s->e);
          pPVar12 = (*((s->ppl).bpp)->vt->new_pktout)(s->kex_reply_value);
          pBVar1 = pPVar12->binarysink_;
          BinarySink_put_stringpl(pBVar1,s->hostkeydata);
          BinarySink_put_mp_ssh2(pBVar1,s->e);
          psVar13 = finalise_and_sign_exhash(s);
          BinarySink_put_stringsb(pBVar1,psVar13);
          pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar12->qnode);
          dh_cleanup(s->dh_ctx);
          s->dh_ctx = (dh_ctx *)0x0;
          mp_free(s->f);
          s->f = (mp_int *)0x0;
          _Var8 = dh_is_gex(s->kex_alg);
          if (_Var8) {
            mp_free(s->g);
            s->g = (mp_int *)0x0;
            mp_free(s->p);
            s->p = (mp_int *)0x0;
          }
          goto LAB_0012e323;
        }
        ssh_proto_error((s->ppl).ssh,"Diffie-Hellman initial packet failed validation: %s",pcVar22);
      }
      else {
        pSVar20 = (s->ppl).ssh;
        pcVar22 = "Unable to parse Diffie-Hellman initial packet";
LAB_0012e430:
        ssh_proto_error(pSVar20,pcVar22);
      }
    }
    else {
      pSVar20 = (s->ppl).ssh;
      pPVar3 = ((s->ppl).bpp)->pls;
      pcVar22 = ssh2_pkt_type(pPVar3->kctx,pPVar3->actx,uVar9);
      pcVar21 = 
      "Received unexpected packet when expecting Diffie-Hellman initial packet, type %d (%s)";
LAB_0012e462:
      ssh_proto_error(pSVar20,pcVar21,(ulong)uVar9,pcVar22);
    }
LAB_0012e471:
    *aborted = true;
  }
  return;
}

Assistant:

void ssh2kex_coroutine(struct ssh2_transport_state *s, bool *aborted)
{
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */
    PktIn *pktin;
    PktOut *pktout;

    crBegin(s->crStateKex);

    {
        int i;
        for (i = 0; i < s->nhostkeys; i++)
            if (ssh_key_alg(s->hostkeys[i]) == s->hostkey_alg) {
                s->hkey = s->hostkeys[i];
                break;
            }
        assert(s->hkey);
    }

    strbuf_clear(s->hostkeyblob);
    ssh_key_public_blob(s->hkey, BinarySink_UPCAST(s->hostkeyblob));
    s->hostkeydata = ptrlen_from_strbuf(s->hostkeyblob);

    put_stringpl(s->exhash, s->hostkeydata);

    if (s->kex_alg->main_type == KEXTYPE_DH) {
        /*
         * If we're doing Diffie-Hellman group exchange, start by
         * waiting for the group request.
         */
        if (dh_is_gex(s->kex_alg)) {
            ppl_logevent("Doing Diffie-Hellman group exchange");
            s->ppl.bpp->pls->kctx = SSH2_PKTCTX_DHGEX;

            crMaybeWaitUntilV((pktin = ssh2_transport_pop(s)) != NULL);
            if (pktin->type != SSH2_MSG_KEX_DH_GEX_REQUEST &&
                pktin->type != SSH2_MSG_KEX_DH_GEX_REQUEST_OLD) {
                ssh_proto_error(s->ppl.ssh, "Received unexpected packet when "
                                "expecting Diffie-Hellman group exchange "
                                "request, type %d (%s)", pktin->type,
                                ssh2_pkt_type(s->ppl.bpp->pls->kctx,
                                              s->ppl.bpp->pls->actx,
                                              pktin->type));
                *aborted = true;
                return;
            }

            if (pktin->type != SSH2_MSG_KEX_DH_GEX_REQUEST_OLD) {
                s->dh_got_size_bounds = true;
                s->dh_min_size = get_uint32(pktin);
                s->pbits = get_uint32(pktin);
                s->dh_max_size = get_uint32(pktin);
            } else {
                s->dh_got_size_bounds = false;
                s->pbits = get_uint32(pktin);
            }

            /*
             * This is a hopeless strategy for making a secure DH
             * group! It's good enough for testing a client against,
             * but not for serious use.
             */
            PrimeGenerationContext *pgc = primegen_new_context(
                &primegen_probabilistic);
            ProgressReceiver null_progress;
            null_progress.vt = &null_progress_vt;
            s->p = primegen_generate(pgc, pcs_new(s->pbits), &null_progress);
            primegen_free_context(pgc);

            s->g = mp_from_integer(2);
            s->dh_ctx = dh_setup_gex(s->p, s->g);
            s->kex_init_value = SSH2_MSG_KEX_DH_GEX_INIT;
            s->kex_reply_value = SSH2_MSG_KEX_DH_GEX_REPLY;

            pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_KEX_DH_GEX_GROUP);
            put_mp_ssh2(pktout, s->p);
            put_mp_ssh2(pktout, s->g);
            pq_push(s->ppl.out_pq, pktout);
        } else {
            s->ppl.bpp->pls->kctx = SSH2_PKTCTX_DHGROUP;
            s->dh_ctx = dh_setup_group(s->kex_alg);
            s->kex_init_value = SSH2_MSG_KEXDH_INIT;
            s->kex_reply_value = SSH2_MSG_KEXDH_REPLY;
            ppl_logevent("Using Diffie-Hellman with standard group \"%s\"",
                         s->kex_alg->groupname);
        }

        ppl_logevent("Doing Diffie-Hellman key exchange with hash %s",
                     ssh_hash_alg(s->exhash)->text_name);

        /*
         * Generate e for Diffie-Hellman.
         */
        s->e = dh_create_e(s->dh_ctx);

        /*
         * Wait to receive f.
         */
        crMaybeWaitUntilV((pktin = ssh2_transport_pop(s)) != NULL);
        if (pktin->type != s->kex_init_value) {
            ssh_proto_error(s->ppl.ssh, "Received unexpected packet when "
                            "expecting Diffie-Hellman initial packet, "
                            "type %d (%s)", pktin->type,
                            ssh2_pkt_type(s->ppl.bpp->pls->kctx,
                                          s->ppl.bpp->pls->actx,
                                          pktin->type));
            *aborted = true;
            return;
        }
        s->f = get_mp_ssh2(pktin);
        if (get_err(pktin)) {
            ssh_proto_error(s->ppl.ssh,
                            "Unable to parse Diffie-Hellman initial packet");
            *aborted = true;
            return;
        }

        {
            const char *err = dh_validate_f(s->dh_ctx, s->f);
            if (err) {
                ssh_proto_error(s->ppl.ssh, "Diffie-Hellman initial packet "
                                "failed validation: %s", err);
                *aborted = true;
                return;
            }
        }
        mp_int *K = dh_find_K(s->dh_ctx, s->f);
        put_mp_ssh2(s->kex_shared_secret, K);
        mp_free(K);

        if (dh_is_gex(s->kex_alg)) {
            if (s->dh_got_size_bounds)
                put_uint32(s->exhash, s->dh_min_size);
            put_uint32(s->exhash, s->pbits);
            if (s->dh_got_size_bounds)
                put_uint32(s->exhash, s->dh_max_size);
            put_mp_ssh2(s->exhash, s->p);
            put_mp_ssh2(s->exhash, s->g);
        }
        put_mp_ssh2(s->exhash, s->f);
        put_mp_ssh2(s->exhash, s->e);

        pktout = ssh_bpp_new_pktout(s->ppl.bpp, s->kex_reply_value);
        put_stringpl(pktout, s->hostkeydata);
        put_mp_ssh2(pktout, s->e);
        put_stringsb(pktout, finalise_and_sign_exhash(s));
        pq_push(s->ppl.out_pq, pktout);

        dh_cleanup(s->dh_ctx);
        s->dh_ctx = NULL;
        mp_free(s->f); s->f = NULL;
        if (dh_is_gex(s->kex_alg)) {
            mp_free(s->g); s->g = NULL;
            mp_free(s->p); s->p = NULL;
        }
    } else if (s->kex_alg->main_type == KEXTYPE_ECDH) {
        char *desc = ecdh_keyalg_description(s->kex_alg);
        ppl_logevent("Doing %s, using hash %s", desc,
                     ssh_hash_alg(s->exhash)->text_name);
        sfree(desc);

        s->ecdh_key = ecdh_key_new(s->kex_alg, true);
        if (!s->ecdh_key) {
            ssh_sw_abort(s->ppl.ssh, "Unable to generate key for ECDH");
            *aborted = true;
            return;
        }

        crMaybeWaitUntilV((pktin = ssh2_transport_pop(s)) != NULL);
        if (pktin->type != SSH2_MSG_KEX_ECDH_INIT) {
            ssh_proto_error(s->ppl.ssh, "Received unexpected packet when "
                            "expecting ECDH initial packet, type %d (%s)",
                            pktin->type,
                            ssh2_pkt_type(s->ppl.bpp->pls->kctx,
                                          s->ppl.bpp->pls->actx,
                                          pktin->type));
            *aborted = true;
            return;
        }

        {
            ptrlen keydata = get_string(pktin);
            put_stringpl(s->exhash, keydata);

            bool ok = ecdh_key_getkey(s->ecdh_key, keydata,
                                      BinarySink_UPCAST(s->kex_shared_secret));
            if (!get_err(pktin) && !ok) {
                ssh_proto_error(s->ppl.ssh, "Received invalid elliptic curve "
                                "point in ECDH initial packet");
                *aborted = true;
                return;
            }
        }

        pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_KEX_ECDH_REPLY);
        put_stringpl(pktout, s->hostkeydata);
        {
            strbuf *pubpoint = strbuf_new();
            ecdh_key_getpublic(s->ecdh_key, BinarySink_UPCAST(pubpoint));
            put_string(s->exhash, pubpoint->u, pubpoint->len);
            put_stringsb(pktout, pubpoint);
        }
        put_stringsb(pktout, finalise_and_sign_exhash(s));
        pq_push(s->ppl.out_pq, pktout);

        ecdh_key_free(s->ecdh_key);
        s->ecdh_key = NULL;
    } else if (s->kex_alg->main_type == KEXTYPE_GSS) {
        ssh_sw_abort(s->ppl.ssh, "GSS key exchange not supported in server");
    } else {
        assert(s->kex_alg->main_type == KEXTYPE_RSA);
        ppl_logevent("Doing RSA key exchange with hash %s",
                     ssh_hash_alg(s->exhash)->text_name);
        s->ppl.bpp->pls->kctx = SSH2_PKTCTX_RSAKEX;

        const struct ssh_rsa_kex_extra *extra =
            (const struct ssh_rsa_kex_extra *)s->kex_alg->extra;

        if (s->ssc && s->ssc->rsa_kex_key) {
            int klen = ssh_rsakex_klen(s->ssc->rsa_kex_key);
            if (klen >= extra->minklen) {
                ppl_logevent("Using configured %d-bit RSA key", klen);
                s->rsa_kex_key = s->ssc->rsa_kex_key;
            } else {
                ppl_logevent("Configured %d-bit RSA key is too short (min %d)",
                             klen, extra->minklen);
            }
        }

        if (!s->rsa_kex_key) {
            ppl_logevent("Generating a %d-bit RSA key", extra->minklen);

            s->rsa_kex_key = snew(RSAKey);

            PrimeGenerationContext *pgc = primegen_new_context(
                &primegen_probabilistic);
            ProgressReceiver null_progress;
            null_progress.vt = &null_progress_vt;
            rsa_generate(s->rsa_kex_key, extra->minklen, false,
                         pgc, &null_progress);
            primegen_free_context(pgc);

            s->rsa_kex_key->comment = NULL;
            s->rsa_kex_key_needs_freeing = true;
        }

        pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_KEXRSA_PUBKEY);
        put_stringpl(pktout, s->hostkeydata);
        {
            strbuf *pubblob = strbuf_new();
            ssh_key_public_blob(&s->rsa_kex_key->sshk,
                                BinarySink_UPCAST(pubblob));
            put_string(s->exhash, pubblob->u, pubblob->len);
            put_stringsb(pktout, pubblob);
        }
        pq_push(s->ppl.out_pq, pktout);

        crMaybeWaitUntilV((pktin = ssh2_transport_pop(s)) != NULL);
        if (pktin->type != SSH2_MSG_KEXRSA_SECRET) {
            ssh_proto_error(s->ppl.ssh, "Received unexpected packet when "
                            "expecting RSA kex secret, type %d (%s)",
                            pktin->type,
                            ssh2_pkt_type(s->ppl.bpp->pls->kctx,
                                          s->ppl.bpp->pls->actx,
                                          pktin->type));
            *aborted = true;
            return;
        }

        mp_int *K;
        {
            ptrlen encrypted_secret = get_string(pktin);
            put_stringpl(s->exhash, encrypted_secret);
            K = ssh_rsakex_decrypt(
                s->rsa_kex_key, s->kex_alg->hash, encrypted_secret);
        }

        if (!K) {
            ssh_proto_error(s->ppl.ssh, "Unable to decrypt RSA kex secret");
            *aborted = true;
            return;
        }

        put_mp_ssh2(s->kex_shared_secret, K);
        mp_free(K);

        if (s->rsa_kex_key_needs_freeing) {
            ssh_rsakex_freekey(s->rsa_kex_key);
            sfree(s->rsa_kex_key);
        }
        s->rsa_kex_key = NULL;
        s->rsa_kex_key_needs_freeing = false;

        pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_KEXRSA_DONE);
        put_stringsb(pktout, finalise_and_sign_exhash(s));
        pq_push(s->ppl.out_pq, pktout);
    }

    crFinishV;
}